

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<siginfo_t> * __thiscall
kj::_::NullableValue<siginfo_t>::operator=
          (NullableValue<siginfo_t> *this,NullableValue<siginfo_t> *other)

{
  anon_struct_128_5_975a5653_for_value *params;
  NullableValue<siginfo_t> *other_local;
  NullableValue<siginfo_t> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<siginfo_t>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<siginfo_t>(&(other->field_1).value);
      ctor<siginfo_t,siginfo_t>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }